

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall Model::Model(Model *this,double cell_volume)

{
  Gillespie local_88;
  SpeciesTracker *local_20;
  SpeciesTracker *tracker;
  double cell_volume_local;
  Model *this_local;
  
  tracker = (SpeciesTracker *)cell_volume;
  cell_volume_local = (double)this;
  std::enable_shared_from_this<Model>::enable_shared_from_this
            (&this->super_enable_shared_from_this<Model>);
  Gillespie::Gillespie(&this->gillespie_);
  std::vector<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>::vector
            (&this->genomes_);
  std::vector<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>::vector
            (&this->transcripts_);
  std::vector<Polymerase,_std::allocator<Polymerase>_>::vector(&this->polymerases_);
  this->cell_volume_ = (double)tracker;
  this->initialized_ = false;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->terminations_);
  local_20 = SpeciesTracker::Instance();
  SpeciesTracker::Clear(local_20);
  local_88.reactions_.
  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.reactions_.
  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.alpha_sum_ = 0.0;
  local_88.reactions_.
  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.alpha_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.alpha_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.iteration_ = 0;
  local_88._20_4_ = 0;
  local_88.alpha_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.initialized_ = false;
  local_88._1_7_ = 0;
  local_88.time_ = 0.0;
  Gillespie::Gillespie(&local_88);
  Gillespie::operator=(&this->gillespie_,&local_88);
  Gillespie::~Gillespie(&local_88);
  Signal<std::shared_ptr<Reaction>_>::ConnectMember<Gillespie>
            (&local_20->propensity_signal_,&this->gillespie_,0x159ba0);
  return;
}

Assistant:

Model::Model(double cell_volume) : cell_volume_(cell_volume) {
  auto &tracker = SpeciesTracker::Instance();
  tracker.Clear();
  gillespie_ = Gillespie();
  tracker.propensity_signal_.ConnectMember(&gillespie_,
                                           &Gillespie::UpdatePropensity);
}